

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoDecompress.c
# Opt level: O0

UINT32 DecodeP(SCRATCH_DATA *Sd)

{
  UINT32 UVar1;
  uint local_1c;
  uint local_18;
  UINT32 Pos;
  UINT32 Mask;
  UINT16 Val;
  SCRATCH_DATA *Sd_local;
  
  Pos._2_2_ = Sd->mPTTable[Sd->mBitBuf >> 0x18];
  if (0x1e < Pos._2_2_) {
    local_18 = 0x800000;
    do {
      if ((Sd->mBitBuf & local_18) == 0) {
        Pos._2_2_ = Sd->mLeft[Pos._2_2_];
      }
      else {
        Pos._2_2_ = Sd->mRight[Pos._2_2_];
      }
      local_18 = local_18 >> 1;
    } while (0x1e < Pos._2_2_);
  }
  FillBuf(Sd,(ushort)Sd->mPTLen[Pos._2_2_]);
  local_1c = (uint)Pos._2_2_;
  if (1 < Pos._2_2_) {
    UVar1 = GetBits(Sd,Pos._2_2_ - 1);
    local_1c = (1 << ((char)Pos._2_2_ - 1U & 0x1f)) + UVar1;
  }
  return local_1c;
}

Assistant:

UINT32
DecodeP (
    IN  SCRATCH_DATA  *Sd
    )
{
    UINT16  Val;
    UINT32  Mask;
    UINT32  Pos;

    Val = Sd->mPTTable[Sd->mBitBuf >> (BITBUFSIZ - 8)];

    if (Val >= MAXNP) {
        Mask = 1U << (BITBUFSIZ - 1 - 8);

        do {
            if ((Sd->mBitBuf & Mask) != 0) {
                Val = Sd->mRight[Val];
            }
            else {
                Val = Sd->mLeft[Val];
            }

            Mask >>= 1;
        } while (Val >= MAXNP);
    }
    //
    // Advance what we have read
    //
    FillBuf (Sd, Sd->mPTLen[Val]);

    Pos = Val;
    if (Val > 1) {
        Pos = (UINT32)((1U << (Val - 1)) + GetBits (Sd, (UINT16)(Val - 1)));
    }

    return Pos;
}